

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

CLabel * __thiscall
IRT::CLabelStatement::Label(CLabel *__return_storage_ptr__,CLabelStatement *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->label);
  return __return_storage_ptr__;
}

Assistant:

CLabel CLabelStatement::Label( ) const {
    return label;
}